

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<llvm::DWARFFormValue> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFFormValue>::operator=
          (SmallVectorImpl<llvm::DWARFFormValue> *this,SmallVectorImpl<llvm::DWARFFormValue> *RHS)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  if (this == RHS) {
    return this;
  }
  uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
  uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
  uVar4 = (ulong)uVar2;
  if (uVar1 <= uVar2) {
    if (uVar1 != 0) {
      memmove((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              BeginX,(RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
                     super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                     super_SmallVectorBase.BeginX,(ulong)uVar1 * 0x30);
    }
    goto LAB_00d8a2a0;
  }
  if ((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity <
      uVar1) {
    (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,(ulong)uVar1,0x30);
LAB_00d8a276:
    uVar4 = 0;
  }
  else {
    if (uVar4 == 0) goto LAB_00d8a276;
    memmove((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX
            ,(RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
             BeginX,uVar4 * 0x30);
  }
  lVar3 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size -
          uVar4;
  if (lVar3 != 0) {
    memcpy((void *)(uVar4 * 0x30 +
                   (long)(this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
                         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                         super_SmallVectorBase.BeginX),
           (void *)((long)(RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
                          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                          super_SmallVectorBase.BeginX + uVar4 * 0x30),lVar3 * 0x30);
  }
LAB_00d8a2a0:
  if (uVar1 <= (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
               Capacity) {
    (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = uVar1;
    return this;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}